

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

string * __thiscall
tinyusdz::(anonymous_namespace)::DumpPrimTreeRec_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Prim *prim,uint32_t depth)

{
  _anonymous_namespace_ *p_Var1;
  string *psVar2;
  ostream *poVar3;
  uint32_t n;
  uint32_t n_00;
  uint uVar4;
  Prim *child;
  _anonymous_namespace_ *this_00;
  stringstream ss;
  allocator local_229;
  string *local_228;
  long local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_228 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((uint)prim < 0x8000001) {
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)((ulong)prim & 0xffffffff),n);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_1f8);
    poVar3 = ::std::operator<<(poVar3,"\"");
    poVar3 = ::std::operator<<(poVar3,(string *)(this + 0x1a0));
    poVar3 = ::std::operator<<(poVar3,"\" ");
    poVar3 = ::std::operator<<(poVar3,(Path *)this);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    uVar4 = (uint)prim + 1;
    pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)(ulong)uVar4,n_00);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_1f8);
    ::std::__cxx11::string::string((string *)&local_218,"prim_id {}",&local_229);
    local_220 = *(long *)(this + 0x318);
    fmt::format<long>(&local_1d8,&local_218,&local_220);
    poVar3 = ::std::operator<<(poVar3,(string *)&local_1d8);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    p_Var1 = *(_anonymous_namespace_ **)(this + 0x2b8);
    for (this_00 = *(_anonymous_namespace_ **)(this + 0x2b0); this_00 != p_Var1;
        this_00 = this_00 + 0x350) {
      DumpPrimTreeRec_abi_cxx11_(&local_1f8,this_00,(Prim *)(ulong)uVar4,depth);
      ::std::operator<<(local_1a8,(string *)&local_1f8);
      ::std::__cxx11::string::_M_dispose();
    }
  }
  psVar2 = local_228;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar2;
}

Assistant:

std::string DumpPrimTreeRec(const Prim &prim, uint32_t depth) {
  std::stringstream ss;

  if (depth > 1024 * 1024 * 128) {
    // too deep node.
    return ss.str();
  }

  ss << pprint::Indent(depth) << "\"" << prim.element_name() << "\" "
     << prim.absolute_path() << "\n";
  ss << pprint::Indent(depth + 1) << fmt::format("prim_id {}", prim.prim_id())
     << "\n";

  for (const Prim &child : prim.children()) {
    ss << DumpPrimTreeRec(child, depth + 1);
  }

  return ss.str();
}